

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugRenderViewportThumbnail(ImDrawList *draw_list,ImGuiViewportP *viewport,ImRect *bb)

{
  ImTextureID in_RDX;
  ImGuiID *in_RSI;
  float fVar1;
  float fVar2;
  ImRect IVar3;
  bool window_is_focused;
  ImRect title_r;
  ImRect thumb_r;
  ImGuiWindow *thumb_window;
  ImGuiWindow **__end1;
  ImGuiWindow **__begin1;
  ImVector<ImGuiWindow_*> *__range1;
  float alpha_mul;
  ImVec2 off;
  ImVec2 scale;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  ImRect *in_stack_fffffffffffffdf8;
  ImGuiWindow *in_stack_fffffffffffffe00;
  ImVec2 *in_stack_fffffffffffffe08;
  ImDrawList *pIVar4;
  ImDrawList *in_stack_fffffffffffffe10;
  ImDrawList *pIVar5;
  float wrap_width;
  ImDrawList *text_end;
  ImRect *text_begin;
  ImU32 col;
  ImFont *font;
  undefined4 in_stack_fffffffffffffe60;
  float in_stack_fffffffffffffe70;
  ImU32 in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  ImVec2 *in_stack_fffffffffffffe80;
  ImRect *in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe90;
  float in_stack_fffffffffffffe94;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImRect local_e8;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImRect local_a8;
  ImRect local_98;
  undefined1 local_88 [40];
  ImDrawVert *local_60;
  ImVector<ImGuiWindow_*> *local_58;
  undefined4 local_4c;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImGuiWindow *local_28;
  ImGuiContext *local_20;
  ImTextureID local_18;
  ImGuiID *local_10;
  
  local_20 = GImGui;
  local_28 = GImGui->CurrentWindow;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = ImRect::GetSize(in_stack_fffffffffffffde8);
  local_30 = operator/(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x202664);
  local_48 = ::operator*(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x202696);
  local_40 = ::operator-(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x2026b4);
  local_4c = 0x3f800000;
  GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe00 >> 0x20),
              SUB84(in_stack_fffffffffffffe00,0));
  ImDrawList::AddRectFilled
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(ImVec2 *)in_stack_fffffffffffffe00
             ,(ImU32)((ulong)in_stack_fffffffffffffdf8 >> 0x20),SUB84(in_stack_fffffffffffffdf8,0),
             (ImDrawFlags)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
  local_58 = &local_20->Windows;
  local_60 = (ImDrawVert *)ImVector<ImGuiWindow_*>::begin(local_58);
  local_88._32_8_ = ImVector<ImGuiWindow_*>::end(local_58);
  for (; local_60 != (ImDrawVert *)local_88._32_8_; local_60 = (ImDrawVert *)&local_60->uv) {
    local_88._24_8_ = local_60->pos;
    if (((*(bool *)(local_88._24_8_ + 0xcb) & 1U) != 0) &&
       ((*(ImGuiWindowFlags *)(local_88._24_8_ + 0x14) & 0x1000000U) == 0)) {
      IVar3 = ImGuiWindow::Rect((ImGuiWindow *)0x2027ea);
      local_88._8_8_ = IVar3.Max;
      local_88._0_8_ = IVar3.Min;
      in_stack_fffffffffffffe80 = (ImVec2 *)(local_88 + 8);
      IVar3 = ImGuiWindow::TitleBarRect(in_stack_fffffffffffffe00);
      local_98.Max = IVar3.Max;
      local_98.Min = IVar3.Min;
      local_c0 = ::operator*(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x202848);
      local_b8 = ::operator+(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x20286e);
      local_b0 = ImTrunc(&in_stack_fffffffffffffde8->Min);
      local_d8 = ::operator*(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x2028a2);
      local_d0 = ::operator+(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x2028c0);
      local_c8 = ImTrunc(&in_stack_fffffffffffffde8->Min);
      ImRect::ImRect(&local_a8,&local_b0,&local_c8);
      local_88._0_4_ = local_a8.Min.x;
      local_88._4_4_ = local_a8.Min.y;
      local_88._8_4_ = local_a8.Max.x;
      local_88._12_4_ = local_a8.Max.y;
      in_stack_fffffffffffffe88 = &local_98;
      local_100 = ::operator*(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x202929);
      local_f8 = ::operator+(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x202947);
      local_f0 = ImTrunc(&in_stack_fffffffffffffde8->Min);
      in_stack_fffffffffffffe90 = local_98.Min.y;
      in_stack_fffffffffffffe94 = local_98.Max.x;
      fVar1 = ImRect::GetHeight(in_stack_fffffffffffffe88);
      ImVec2::ImVec2(&local_120,in_stack_fffffffffffffe94,fVar1 * 3.0 + in_stack_fffffffffffffe90);
      local_118 = ::operator*(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x2029e6);
      local_110 = ::operator+(&in_stack_fffffffffffffde8->Min,(ImVec2 *)0x202a04);
      local_108 = ImTrunc(&in_stack_fffffffffffffde8->Min);
      ImRect::ImRect(&local_e8,&local_f0,&local_108);
      local_98.Min = local_e8.Min;
      local_98.Max = local_e8.Max;
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      ImRect::ClipWithFull((ImRect *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      pIVar4 = local_28->DrawList;
      pIVar5 = (ImDrawList *)local_88;
      wrap_width = (float)((ulong)(local_88 + 8) >> 0x20);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                  SUB84(in_stack_fffffffffffffe00,0));
      ImDrawList::AddRectFilled
                (pIVar5,(ImVec2 *)pIVar4,(ImVec2 *)in_stack_fffffffffffffe00,
                 (ImU32)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 SUB84(in_stack_fffffffffffffdf8,0),
                 (ImDrawFlags)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      text_end = local_28->DrawList;
      text_begin = &local_98;
      col = (ImU32)((ulong)&local_98.Max >> 0x20);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                  SUB84(in_stack_fffffffffffffe00,0));
      ImDrawList::AddRectFilled
                (pIVar5,(ImVec2 *)pIVar4,(ImVec2 *)in_stack_fffffffffffffe00,
                 (ImU32)((ulong)in_stack_fffffffffffffdf8 >> 0x20),
                 SUB84(in_stack_fffffffffffffdf8,0),
                 (ImDrawFlags)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
      pIVar5 = local_28->DrawList;
      fVar1 = (float)((ulong)local_88 >> 0x20);
      font = (ImFont *)(local_88 + 8);
      GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                  SUB84(in_stack_fffffffffffffe00,0));
      ImDrawList::AddRect((ImDrawList *)
                          CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          &in_stack_fffffffffffffe88->Min,in_stack_fffffffffffffe80,
                          (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                          SUB84(in_stack_fffffffffffffe78,0),in_stack_fffffffffffffe74,
                          in_stack_fffffffffffffe70);
      pIVar4 = local_28->DrawList;
      fVar2 = local_20->FontSize * 1.0;
      in_stack_fffffffffffffe74 =
           GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                       SUB84(in_stack_fffffffffffffe00,0));
      in_stack_fffffffffffffe78 = *(char **)(local_88._24_8_ + 8);
      FindRenderedTextEnd(*(char **)(local_88._24_8_ + 8),(char *)0x0);
      in_stack_fffffffffffffde8 = (ImRect *)0x0;
      ImDrawList::AddText(pIVar4,font,fVar1,(ImVec2 *)pIVar5,col,(char *)text_begin,(char *)text_end
                          ,wrap_width,(ImVec4 *)CONCAT44(fVar2,in_stack_fffffffffffffe60));
    }
  }
  GetColorU32((ImGuiCol)((ulong)((long)local_18 + 8) >> 0x20),(float)((long)local_18 + 8));
  ImDrawList::AddRect((ImDrawList *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                      &in_stack_fffffffffffffe88->Min,in_stack_fffffffffffffe80,
                      (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                      SUB84(in_stack_fffffffffffffe78,0),in_stack_fffffffffffffe74,
                      in_stack_fffffffffffffe70);
  if (*local_10 == (local_20->DebugMetricsConfig).HighlightViewportID) {
    ImDrawList::AddRect((ImDrawList *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        &in_stack_fffffffffffffe88->Min,in_stack_fffffffffffffe80,
                        (ImU32)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                        SUB84(in_stack_fffffffffffffe78,0),in_stack_fffffffffffffe74,
                        in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void ImGui::DebugRenderViewportThumbnail(ImDrawList* draw_list, ImGuiViewportP* viewport, const ImRect& bb)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImVec2 scale = bb.GetSize() / viewport->Size;
    ImVec2 off = bb.Min - viewport->Pos * scale;
    float alpha_mul = 1.0f;
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul * 0.40f));
    for (ImGuiWindow* thumb_window : g.Windows)
    {
        if (!thumb_window->WasActive || (thumb_window->Flags & ImGuiWindowFlags_ChildWindow))
            continue;

        ImRect thumb_r = thumb_window->Rect();
        ImRect title_r = thumb_window->TitleBarRect();
        thumb_r = ImRect(ImTrunc(off + thumb_r.Min * scale), ImTrunc(off +  thumb_r.Max * scale));
        title_r = ImRect(ImTrunc(off + title_r.Min * scale), ImTrunc(off +  ImVec2(title_r.Max.x, title_r.Min.y + title_r.GetHeight() * 3.0f) * scale)); // Exaggerate title bar height
        thumb_r.ClipWithFull(bb);
        title_r.ClipWithFull(bb);
        const bool window_is_focused = (g.NavWindow && thumb_window->RootWindowForTitleBarHighlight == g.NavWindow->RootWindowForTitleBarHighlight);
        window->DrawList->AddRectFilled(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_WindowBg, alpha_mul));
        window->DrawList->AddRectFilled(title_r.Min, title_r.Max, GetColorU32(window_is_focused ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg, alpha_mul));
        window->DrawList->AddRect(thumb_r.Min, thumb_r.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
        window->DrawList->AddText(g.Font, g.FontSize * 1.0f, title_r.Min, GetColorU32(ImGuiCol_Text, alpha_mul), thumb_window->Name, FindRenderedTextEnd(thumb_window->Name));
    }
    draw_list->AddRect(bb.Min, bb.Max, GetColorU32(ImGuiCol_Border, alpha_mul));
    if (viewport->ID == g.DebugMetricsConfig.HighlightViewportID)
        window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
}